

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.hpp
# Opt level: O0

string * __thiscall
pstore::indirect_string::to_string_abi_cxx11_(string *__return_storage_ptr__,indirect_string *this)

{
  allocator<char> local_55 [13];
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_48;
  raw_sstring_view local_40;
  undefined1 local_30 [8];
  shared_sstring_view owner;
  indirect_string *this_local;
  
  owner.size_ = (size_type)this;
  sstring_view<std::shared_ptr<const_char>_>::sstring_view
            ((sstring_view<std::shared_ptr<const_char>_> *)local_30);
  gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::not_null
            (&local_48,(sstring_view<std::shared_ptr<const_char>_> *)local_30);
  local_40 = as_string_view(this,local_48);
  std::allocator<char>::allocator();
  sstring_view<char_const*>::to_string<std::allocator<char>>
            (__return_storage_ptr__,(sstring_view<char_const*> *)&local_40,local_55);
  std::allocator<char>::~allocator(local_55);
  sstring_view<std::shared_ptr<const_char>_>::~sstring_view
            ((sstring_view<std::shared_ptr<const_char>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string () const {
            shared_sstring_view owner;
            return this->as_string_view (&owner).to_string ();
        }